

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::ClearInlineCaches(ThreadContext *this)

{
  ScriptContext *pSVar1;
  bool bVar2;
  size_t sVar3;
  ScriptContext **ppSVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
  if (bVar2) {
    uVar7 = 0;
    uVar8 = 0;
    uVar5 = 0;
    uVar6 = 0;
    ppSVar4 = &this->scriptContextList;
    while (pSVar1 = *ppSVar4, pSVar1 != (ScriptContext *)0x0) {
      uVar6 = uVar6 + 1;
      sVar3 = Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
              AllocatedSize(&(pSVar1->inlineCacheAllocator).
                             super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                           );
      uVar8 = uVar8 + (pSVar1->inlineCacheAllocator).
                      super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                      .freeListSize;
      uVar7 = uVar7 + sVar3;
      uVar5 = uVar5 + (pSVar1->inlineCacheAllocator).polyCacheAllocSize;
      ppSVar4 = &pSVar1->next;
    }
    Output::Print(L"Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"
                  ,uVar7 >> 10,uVar8 >> 10,uVar5 >> 10,(ulong)uVar6);
  }
  ppSVar4 = &this->scriptContextList;
  while (pSVar1 = *ppSVar4, pSVar1 != (ScriptContext *)0x0) {
    Js::ScriptContext::ClearInlineCaches(pSVar1);
    ppSVar4 = &pSVar1->next;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
            (&(this->inlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  (this->protoInlineCacheByPropId).size = 0;
  (this->protoInlineCacheByPropId).bucketCount = 0;
  (this->protoInlineCacheByPropId).count = 0;
  (this->protoInlineCacheByPropId).freeCount = 0;
  (this->protoInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->protoInlineCacheByPropId).buckets = (Type)0x0;
  (this->protoInlineCacheByPropId).entries = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).size = 0;
  (this->storeFieldInlineCacheByPropId).bucketCount = 0;
  (this->storeFieldInlineCacheByPropId).count = 0;
  (this->storeFieldInlineCacheByPropId).freeCount = 0;
  (this->storeFieldInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->storeFieldInlineCacheByPropId).buckets = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).entries = (Type)0x0;
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  return;
}

Assistant:

void
ThreadContext::ClearInlineCaches()
{
    if (PHASE_TRACE1(Js::InlineCachePhase))
    {
        size_t size = 0;
        size_t freeListSize = 0;
        size_t polyInlineCacheSize = 0;
        uint scriptContextCount = 0;
        for (Js::ScriptContext *scriptContext = scriptContextList;
            scriptContext;
            scriptContext = scriptContext->next)
        {
            scriptContextCount++;
            size += scriptContext->GetInlineCacheAllocator()->AllocatedSize();
            freeListSize += scriptContext->GetInlineCacheAllocator()->FreeListSize();
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            polyInlineCacheSize += scriptContext->GetInlineCacheAllocator()->GetPolyInlineCacheSize();
#endif
        };
        Output::Print(_u("Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"),
            static_cast<uint64>(size / 1024), static_cast<uint64>(freeListSize / 1024), static_cast<uint64>(polyInlineCacheSize / 1024), scriptContextCount);
    }

    Js::ScriptContext *scriptContext = this->scriptContextList;
    while (scriptContext != nullptr)
    {
        scriptContext->ClearInlineCaches();
        scriptContext = scriptContext->next;
    }

    inlineCacheThreadInfoAllocator.Reset();
    protoInlineCacheByPropId.ResetNoDelete();
    storeFieldInlineCacheByPropId.ResetNoDelete();

    registeredInlineCacheCount = 0;
    unregisteredInlineCacheCount = 0;
}